

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_csvmodelserialiser.cpp
# Opt level: O1

void __thiscall
tst_CsvModelSerialiser::basicSaveLoadData(tst_CsvModelSerialiser *this,QObject *parent)

{
  tst_SerialiserCommon *this_00;
  __atomic_base<int> _Var1;
  QTestData *pQVar2;
  QStringListModel *this_01;
  QStandardItemModel *this_02;
  QMetaTypeInterface *local_38;
  QStringListModel *local_30;
  
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId.
               _q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<const_QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"sourceModel");
  local_38 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var1._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var1._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var1._M_i,"destinationModel");
  pQVar2 = (QTestData *)QTest::newRow("List Single Role");
  this_00 = &this->super_tst_SerialiserCommon;
  local_38 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  this_01 = (QStringListModel *)operator_new(0x28);
  QStringListModel::QStringListModel(this_01,&this->super_QObject);
  local_30 = this_01;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("List Single Role Overwrite");
  local_38 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)
             tst_SerialiserCommon::createStringModel(this_00,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Table Single Role");
  local_38 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  this_02 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_02,&this->super_QObject);
  local_30 = (QStringListModel *)this_02;
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  pQVar2 = (QTestData *)QTest::newRow("Table Single Role Overwrite");
  local_38 = (QMetaTypeInterface *)
             tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  pQVar2 = operator<<(pQVar2,(QAbstractItemModel **)&local_38);
  local_30 = (QStringListModel *)
             tst_SerialiserCommon::createComplexModel(this_00,false,false,&this->super_QObject);
  operator<<(pQVar2,(QAbstractItemModel **)&local_30);
  return;
}

Assistant:

void tst_CsvModelSerialiser::basicSaveLoadData(QObject *parent)
{
    Q_UNUSED(parent)
    QTest::addColumn<const QAbstractItemModel *>("sourceModel");
    QTest::addColumn<QAbstractItemModel *>("destinationModel");
    QTest::newRow("List Single Role") << static_cast<const QAbstractItemModel *>(createStringModel(this))
                                      << static_cast<QAbstractItemModel *>(new QStringListModel(this));
    QTest::newRow("List Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createStringModel(this)) << createStringModel(this);
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::newRow("Table Single Role") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this))
                                       << static_cast<QAbstractItemModel *>(new ComplexModel(this));
    QTest::newRow("Table Single Role Overwrite") << static_cast<const QAbstractItemModel *>(createComplexModel(false, false, this))
                                                 << createComplexModel(false, false, this);
#endif
}